

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

int ON_FontList::CompareFontCharacteristicsHash(ON_Font **lhs,ON_Font **rhs)

{
  ON_Font *this;
  ON_Font *this_00;
  int iVar1;
  ON_SHA1_Hash *a;
  ON_SHA1_Hash *b;
  
  iVar1 = 0;
  if (lhs != rhs) {
    if (lhs == (ON_Font **)0x0) {
      iVar1 = 1;
    }
    else if (rhs == (ON_Font **)0x0) {
      iVar1 = -1;
    }
    else {
      this = *lhs;
      this_00 = *rhs;
      iVar1 = 0;
      if (((this != this_00) && (iVar1 = 1, this != (ON_Font *)0x0)) &&
         (iVar1 = -1, this_00 != (ON_Font *)0x0)) {
        a = ON_Font::FontCharacteristicsHash(this);
        b = ON_Font::FontCharacteristicsHash(this_00);
        iVar1 = ON_SHA1_Hash::Compare(a,b);
        return iVar1;
      }
    }
  }
  return iVar1;
}

Assistant:

int ON_FontList::CompareFontCharacteristicsHash(
  ON_Font const* const* lhs,
  ON_Font const* const* rhs
)
{
  ON_ManagedFonts_CompareFontPointer(lhs, rhs);
  return ON_SHA1_Hash::Compare(lhs_font->FontCharacteristicsHash(), rhs_font->FontCharacteristicsHash());
}